

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void unpack_weights_and_set_round_const_avx2
               (ConvolveParams *conv_params,int round_bits,int offset_bits,__m256i *res_sub_const,
               __m256i *round_bits_const,__m256i *wt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  byte bVar7;
  uint uVar8;
  ushort uVar9;
  undefined8 *in_RCX;
  char in_DL;
  byte in_SIL;
  long in_RDI;
  undefined8 *in_R8;
  undefined1 (*in_R9) [32];
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  ushort local_1b8;
  ushort local_1b4;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  bVar7 = in_DL - (char)*(undefined4 *)(in_RDI + 0x18);
  uVar9 = -((short)(1 << (bVar7 & 0x1f)) + (short)(1 << (bVar7 - 1 & 0x1f)));
  auVar2 = vpinsrw_avx(ZEXT216(uVar9),(uint)uVar9,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,6);
  auVar2 = vpinsrw_avx(auVar2,(uint)uVar9,7);
  auVar3 = vpinsrw_avx(ZEXT216(uVar9),(uint)uVar9,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,6);
  auVar3 = vpinsrw_avx(auVar3,(uint)uVar9,7);
  local_180 = auVar2._0_8_;
  uStack_178 = auVar2._8_8_;
  uStack_170 = auVar3._0_8_;
  uStack_168 = auVar3._8_8_;
  *in_RCX = local_180;
  in_RCX[1] = uStack_178;
  in_RCX[2] = uStack_170;
  in_RCX[3] = uStack_168;
  uVar8 = (uint)(1 << (in_SIL & 0x1f)) >> 1;
  auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar8),uVar8 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,7);
  auVar3 = vpinsrw_avx(ZEXT216((ushort)uVar8),uVar8 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,7);
  local_140 = auVar2._0_8_;
  uStack_138 = auVar2._8_8_;
  uStack_130 = auVar3._0_8_;
  uStack_128 = auVar3._8_8_;
  *in_R8 = local_140;
  in_R8[1] = uStack_138;
  in_R8[2] = uStack_130;
  in_R8[3] = uStack_128;
  uVar8 = *(uint *)(in_RDI + 0x28);
  uVar1 = *(uint *)(in_RDI + 0x2c);
  local_1b4 = (ushort)uVar8;
  auVar2 = vpinsrw_avx(ZEXT216(local_1b4),uVar8 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar8 & 0xffff,7);
  auVar3 = vpinsrw_avx(ZEXT216(local_1b4),uVar8 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar8 & 0xffff,7);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  local_1b8 = (ushort)uVar1;
  auVar3 = vpinsrw_avx(ZEXT216(local_1b8),uVar1 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar1 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216(local_1b8),uVar1 & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar4,uVar1 & 0xffff,7);
  uStack_b0 = auVar4._0_8_;
  uStack_a8 = auVar4._8_8_;
  auVar6._16_8_ = uStack_f0;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_e8;
  auVar5._16_8_ = uStack_b0;
  auVar5._0_16_ = auVar3;
  auVar5._24_8_ = uStack_a8;
  auVar5 = vpunpcklwd_avx2(auVar6,auVar5);
  *in_R9 = auVar5;
  return;
}

Assistant:

static inline void unpack_weights_and_set_round_const_avx2(
    ConvolveParams *conv_params, const int round_bits, const int offset_bits,
    __m256i *res_sub_const, __m256i *round_bits_const, __m256i *wt) {
  *res_sub_const =
      _mm256_set1_epi16(-(1 << (offset_bits - conv_params->round_1)) -
                        (1 << (offset_bits - conv_params->round_1 - 1)));
  *round_bits_const = _mm256_set1_epi16(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi16((short)w0);
  const __m256i wt1 = _mm256_set1_epi16((short)w1);
  *wt = _mm256_unpacklo_epi16(wt0, wt1);
}